

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_fan_calib(envy_bios *bios,FILE *out,uint mask)

{
  int16_t iVar1;
  int16_t iVar2;
  envy_bios_power_fan_calib *peVar3;
  short local_ca;
  char local_c8 [2];
  int16_t high;
  int16_t low;
  int16_t div;
  char model [100];
  envy_bios_power_fan_calib_entry *e;
  int i;
  envy_bios_power_fan_calib *fan_calib;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar3 = &(bios->power).fan_calib;
  if ((peVar3->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).fan_calib.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse FAN CALIBRATION table at 0x%x, version %x\n",
              (ulong)peVar3->offset,(ulong)(bios->power).fan_calib.version);
    }
    else {
      fprintf((FILE *)out,"FAN CALIBRATION table at 0x%x, version %x\n",(ulong)peVar3->offset,
              (ulong)(bios->power).fan_calib.version);
      envy_bios_dump_hex(bios,out,peVar3->offset,(uint)(bios->power).fan_calib.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (e._4_4_ = 0; (int)e._4_4_ < (int)(uint)(bios->power).fan_calib.entriesnum;
          e._4_4_ = e._4_4_ + 1) {
        register0x00000000 = (bios->power).fan_calib.entries + (int)e._4_4_;
        if ((register0x00000000->enable == '\x01') && ((register0x00000000->mode & 7) == 1)) {
          if (bios->chipset < 0xc0) {
            strncpy(local_c8,"unsupported chipset",100);
          }
          else {
            iVar1 = envy_bios_parse_power_fan_calib_model(register0x00000000,'\0',&local_ca);
            iVar2 = envy_bios_parse_power_fan_calib_model(stack0xffffffffffffffa0,'d',&local_ca);
            snprintf(local_c8,100,"div=0x%hx, duty at 0%% = 0x%hx, duty at 100%% = 0x%hx",
                     (ulong)(uint)(int)local_ca,(ulong)(uint)(int)iVar1,(ulong)(uint)(int)iVar2);
          }
          fprintf((FILE *)out,
                  "-- %i: mode_high %u mode_low %u unk02 %hu unk04 %hu unk06 %hu PWM freq %hu Hz duty max %d duty offset %d unk0e %hi unk10 %hu unk12 %hu (%s) --\n"
                  ,(ulong)e._4_4_,(ulong)(uint)((int)(uint)stack0xffffffffffffffa0->mode >> 4),
                  (ulong)(stack0xffffffffffffffa0->mode & 7),(ulong)stack0xffffffffffffffa0->unk02,
                  (uint)stack0xffffffffffffffa0->unk04,(uint)stack0xffffffffffffffa0->unk06,
                  (uint)stack0xffffffffffffffa0->pwm_freq,(uint)stack0xffffffffffffffa0->duty_max,
                  (int)stack0xffffffffffffffa0->duty_offset,(int)stack0xffffffffffffffa0->unk0e,
                  (uint)stack0xffffffffffffffa0->unk10,(uint)stack0xffffffffffffffa0->unk12,local_c8
                 );
        }
        envy_bios_dump_hex(bios,out,(bios->power).fan_calib.entries[(int)e._4_4_].offset,
                           (uint)(bios->power).fan_calib.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_fan_calib(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_fan_calib *fan_calib = &bios->power.fan_calib;
	int i;

	if (!fan_calib->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!fan_calib->valid) {
		fprintf(out, "Failed to parse FAN CALIBRATION table at 0x%x, version %x\n", fan_calib->offset, fan_calib->version);
		return;
	}

	fprintf(out, "FAN CALIBRATION table at 0x%x, version %x\n", fan_calib->offset, fan_calib->version);
	envy_bios_dump_hex(bios, out, fan_calib->offset, fan_calib->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < fan_calib->entriesnum; i++) {
		struct envy_bios_power_fan_calib_entry *e = &fan_calib->entries[i];
		if (e->enable == 1 && (e->mode & 0x7) == 1) {
			char model[100];

			/* TODO: figure out the nvaX case */
			if (bios->chipset >= 0xc0) {
				int16_t div, low, high;
				low = envy_bios_parse_power_fan_calib_model(e, 0, &div);
				high = envy_bios_parse_power_fan_calib_model(e, 100, &div);

				snprintf(model, sizeof(model),
				         "div=0x%hx, duty at 0%% = 0x%hx, duty at 100%% = 0x%hx",
				         div, low, high);
			} else {
				strncpy(model, "unsupported chipset", sizeof(model));
			}


			fprintf(out, "-- %i: mode_high %u mode_low %u unk02 %hu unk04 %hu "
					"unk06 %hu PWM freq %hu Hz duty max %d duty offset %d "
					"unk0e %hi unk10 %hu unk12 %hu (%s) --\n",
					i, e->mode >> 4, e->mode & 0x7, e->unk02, e->unk04, e->unk06,
					e->pwm_freq, e->duty_max, e->duty_offset, e->unk0e,
					e->unk10, e->unk12, model);
		}

		envy_bios_dump_hex(bios, out, fan_calib->entries[i].offset, fan_calib->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}